

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_cond_timedwait(uv_cond_t *cond,uv_mutex_t *mutex,uint64_t timeout)

{
  int iVar1;
  uint64_t uVar2;
  timespec ts;
  
  uVar2 = uv__hrtime(UV_CLOCK_PRECISE);
  ts.tv_sec = (uVar2 + timeout) / 1000000000;
  ts.tv_nsec = (uVar2 + timeout) % 1000000000;
  iVar1 = pthread_cond_timedwait((pthread_cond_t *)cond,(pthread_mutex_t *)mutex,(timespec *)&ts);
  if (iVar1 != 0) {
    if (iVar1 != 0x6e) {
      abort();
    }
    iVar1 = -0x6e;
  }
  return iVar1;
}

Assistant:

int uv_cond_timedwait(uv_cond_t* cond, uv_mutex_t* mutex, uint64_t timeout) {
  int r;
  struct timespec ts;
#if defined(__MVS__)
  struct timeval tv;
#endif

#if defined(__APPLE__) && defined(__MACH__)
  ts.tv_sec = timeout / NANOSEC;
  ts.tv_nsec = timeout % NANOSEC;
  r = pthread_cond_timedwait_relative_np(cond, mutex, &ts);
#else
#if defined(__MVS__)
  if (gettimeofday(&tv, NULL))
    abort();
  timeout += tv.tv_sec * NANOSEC + tv.tv_usec * 1e3;
#else
  timeout += uv__hrtime(UV_CLOCK_PRECISE);
#endif
  ts.tv_sec = timeout / NANOSEC;
  ts.tv_nsec = timeout % NANOSEC;
#if defined(__ANDROID_API__) && __ANDROID_API__ < 21

  /*
   * The bionic pthread implementation doesn't support CLOCK_MONOTONIC,
   * but has this alternative function instead.
   */
  r = pthread_cond_timedwait_monotonic_np(cond, mutex, &ts);
#else
  r = pthread_cond_timedwait(cond, mutex, &ts);
#endif /* __ANDROID_API__ */
#endif


  if (r == 0)
    return 0;

  if (r == ETIMEDOUT)
    return UV_ETIMEDOUT;

  abort();
  return UV_EINVAL;  /* Satisfy the compiler. */
}